

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall gl4cts::EnhancedLayouts::Utils::Buffer::Bind(Buffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  Bind((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,this->m_buffer);
  return;
}

Assistant:

void Buffer::Bind() const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	Bind(gl, m_id, m_buffer);
}